

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat_strings.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  string buffer;
  string second;
  string first;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"Hello ",(allocator<char> *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"World",(allocator<char> *)&bStack_68);
  std::operator+(&bStack_68,&local_28,&local_48);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&bStack_68);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&bStack_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return 0;
}

Assistant:

int main() {

  std::string first = "Hello ";
  std::string second = "World";
  std::string buffer = first + second;

  std::cout << buffer << "\n";
}